

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

float GD::get_scale<0ul>(gd *g,example *param_2,float weight)

{
  float fVar1;
  shared_data *psVar2;
  float fVar3;
  
  fVar1 = g->all->eta;
  psVar2 = g->all->sd;
  fVar3 = powf((float)(((double)weight + psVar2->t) - psVar2->weighted_holdout_examples),
               g->neg_power_t);
  return fVar3 * weight * fVar1;
}

Assistant:

float get_scale(gd& g, example& /* ec */, float weight)
{
  float update_scale = g.all->eta * weight;
  if (!adaptive)
  {
    float t = (float)(g.all->sd->t + weight - g.all->sd->weighted_holdout_examples);
    update_scale *= powf(t, g.neg_power_t);
  }
  return update_scale;
}